

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ParseSidedef(UDMFParser *this,side_t *sd,intmapsidedef_t *sdt,int index)

{
  BYTE *value;
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  FName FVar5;
  bool bVar6;
  int iVar7;
  char *copyStr;
  intmapsidedef_t *this_00;
  double dVar8;
  FName local_60;
  FName key;
  double local_58;
  double dStack_50;
  
  memset(sd,0,0xc0);
  FString::operator=(&sdt->bottomtexture,"-");
  FString::operator=(&sdt->toptexture,"-");
  FString::operator=(&sdt->midtexture,"-");
  sd->textures[2].xScale = 1.0;
  sd->textures[2].yScale = 1.0;
  sd->textures[1].xScale = 1.0;
  sd->textures[1].yScale = 1.0;
  sd->textures[0].xScale = 1.0;
  sd->textures[0].yScale = 1.0;
  sd->Index = index;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  value = &sd->Flags;
  local_58 = 0.0;
  dStack_50 = 0.0;
LAB_0045dd91:
  bVar6 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar6) {
    dVar8 = sd->textures[1].xOffset;
    dVar2 = sd->textures[1].yOffset;
    dVar3 = sd->textures[2].xOffset;
    dVar4 = sd->textures[2].yOffset;
    sd->textures[0].xOffset = sd->textures[0].xOffset + local_58;
    sd->textures[0].yOffset = sd->textures[0].yOffset + dStack_50;
    sd->textures[1].xOffset = dVar8 + local_58;
    sd->textures[1].yOffset = dVar2 + dStack_50;
    sd->textures[2].xOffset = dVar3 + local_58;
    sd->textures[2].yOffset = dVar4 + dStack_50;
    return;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
  FVar5 = key;
  switch(key.Index) {
  case 0x125:
    iVar7 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x125].Text);
    local_58 = (double)iVar7;
    goto LAB_0045dd91;
  case 0x126:
    iVar7 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x126].Text);
    dStack_50 = (double)iVar7;
    goto LAB_0045dd91;
  case 0x127:
    copyStr = UDMFParserBase::CheckString
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x127].Text);
    this_00 = sdt;
    break;
  case 0x128:
    copyStr = UDMFParserBase::CheckString
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x128].Text);
    this_00 = (intmapsidedef_t *)&sdt->bottomtexture;
    break;
  case 0x129:
    copyStr = UDMFParserBase::CheckString
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x129].Text);
    this_00 = (intmapsidedef_t *)&sdt->midtexture;
    break;
  case 0x12a:
    iVar7 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x12a].Text);
    sd->sector = (sector_t_conflict *)(long)iVar7;
    goto LAB_0045dd91;
  default:
    uVar1 = (this->super_UDMFParserBase).namespace_bits;
    if ((uVar1 & 0x70) == 0) {
LAB_0045df5a:
      if (((uVar1 & 0x30) != 0) &&
         (iVar7 = strncasecmp("user_",FName::NameData.NameArray[key.Index].Text,5), iVar7 == 0)) {
        local_60.Index = FVar5.Index;
        AddUserKey(this,&local_60,1,index);
      }
    }
    else {
      switch(key.Index) {
      case 0x1b7:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b7].Text);
        sd->textures[0].xOffset = dVar8;
        break;
      case 0x1b8:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b8].Text);
        sd->textures[0].yOffset = dVar8;
        break;
      case 0x1b9:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1b9].Text);
        sd->textures[1].xOffset = dVar8;
        break;
      case 0x1ba:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1ba].Text);
        sd->textures[1].yOffset = dVar8;
        break;
      case 0x1bb:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1bb].Text);
        sd->textures[2].xOffset = dVar8;
        break;
      case 0x1bc:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1bc].Text);
        sd->textures[2].yOffset = dVar8;
        break;
      case 0x1bd:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1bd].Text);
        sd->textures[0].xScale =
             (double)(-(ulong)(dVar8 == 0.0) & 0x3ff0000000000000 |
                     ~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
        break;
      case 0x1be:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1be].Text);
        sd->textures[0].yScale =
             (double)(-(ulong)(dVar8 == 0.0) & 0x3ff0000000000000 |
                     ~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
        break;
      case 0x1bf:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1bf].Text);
        sd->textures[1].xScale =
             (double)(-(ulong)(dVar8 == 0.0) & 0x3ff0000000000000 |
                     ~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
        break;
      case 0x1c0:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1c0].Text);
        sd->textures[1].yScale =
             (double)(-(ulong)(dVar8 == 0.0) & 0x3ff0000000000000 |
                     ~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
        break;
      case 0x1c1:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1c1].Text);
        sd->textures[2].xScale =
             (double)(-(ulong)(dVar8 == 0.0) & 0x3ff0000000000000 |
                     ~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
        break;
      case 0x1c2:
        dVar8 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1c2].Text);
        sd->textures[2].yScale =
             (double)(-(ulong)(dVar8 == 0.0) & 0x3ff0000000000000 |
                     ~-(ulong)(dVar8 == 0.0) & (ulong)dVar8);
        break;
      case 0x1c3:
        iVar7 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1c3].Text);
        sd->Light = (SWORD)iVar7;
        break;
      case 0x1c4:
        UDMFParserBase::Flag<unsigned_char>
                  (&this->super_UDMFParserBase,value,1,FName::NameData.NameArray[0x1c4].Text);
        break;
      case 0x1c5:
        UDMFParserBase::Flag<unsigned_char>
                  (&this->super_UDMFParserBase,value,0x80,FName::NameData.NameArray[0x1c5].Text);
        break;
      case 0x1c6:
        UDMFParserBase::Flag<unsigned_char>
                  (&this->super_UDMFParserBase,value,4,FName::NameData.NameArray[0x1c6].Text);
        break;
      case 0x1c7:
        UDMFParserBase::Flag<unsigned_char>
                  (&this->super_UDMFParserBase,value,8,FName::NameData.NameArray[0x1c7].Text);
        break;
      default:
        if (key.Index == 0x130) {
          UDMFParserBase::Flag<unsigned_char>
                    (&this->super_UDMFParserBase,value,2,FName::NameData.NameArray[0x130].Text);
        }
        else if (key.Index == 0x177) {
          UDMFParserBase::Flag<unsigned_char>
                    (&this->super_UDMFParserBase,value,0x10,FName::NameData.NameArray[0x177].Text);
        }
        else {
          if (key.Index != 0x178) goto LAB_0045df5a;
          UDMFParserBase::Flag<unsigned_char>
                    (&this->super_UDMFParserBase,value,0x20,FName::NameData.NameArray[0x178].Text);
        }
      }
    }
    goto LAB_0045dd91;
  }
  FString::operator=(&this_00->toptexture,copyStr);
  goto LAB_0045dd91;
}

Assistant:

void ParseSidedef(side_t *sd, intmapsidedef_t *sdt, int index)
	{
		double texOfs[2]={0,0};

		memset(sd, 0, sizeof(*sd));
		sdt->bottomtexture = "-";
		sdt->toptexture = "-";
		sdt->midtexture = "-";
		sd->SetTextureXScale(1.);
		sd->SetTextureYScale(1.);
		sd->Index = index;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Offsetx:
				texOfs[0] = CheckInt(key);
				continue;

			case NAME_Offsety:
				texOfs[1] = CheckInt(key);
				continue;

			case NAME_Texturetop:
				sdt->toptexture = CheckString(key);
				continue;

			case NAME_Texturebottom:
				sdt->bottomtexture = CheckString(key);
				continue;

			case NAME_Texturemiddle:
				sdt->midtexture = CheckString(key);
				continue;

			case NAME_Sector:
				sd->sector = (sector_t*)(intptr_t)CheckInt(key);
				continue;

			default:
				break;
			}

			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_offsetx_top:
				sd->SetTextureXOffset(side_t::top, CheckFloat(key));
				continue;

			case NAME_offsety_top:
				sd->SetTextureYOffset(side_t::top, CheckFloat(key));
				continue;

			case NAME_offsetx_mid:
				sd->SetTextureXOffset(side_t::mid, CheckFloat(key));
				continue;

			case NAME_offsety_mid:
				sd->SetTextureYOffset(side_t::mid, CheckFloat(key));
				continue;

			case NAME_offsetx_bottom:
				sd->SetTextureXOffset(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_offsety_bottom:
				sd->SetTextureYOffset(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_scalex_top:
				sd->SetTextureXScale(side_t::top, CheckFloat(key));
				continue;

			case NAME_scaley_top:
				sd->SetTextureYScale(side_t::top, CheckFloat(key));
				continue;

			case NAME_scalex_mid:
				sd->SetTextureXScale(side_t::mid, CheckFloat(key));
				continue;

			case NAME_scaley_mid:
				sd->SetTextureYScale(side_t::mid, CheckFloat(key));
				continue;

			case NAME_scalex_bottom:
				sd->SetTextureXScale(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_scaley_bottom:
				sd->SetTextureYScale(side_t::bottom, CheckFloat(key));
				continue;

			case NAME_light:
				sd->SetLight(CheckInt(key));
				continue;

			case NAME_lightabsolute:
				Flag(sd->Flags, WALLF_ABSLIGHTING, key);
				continue;

			case NAME_lightfog:
				Flag(sd->Flags, WALLF_LIGHT_FOG, key);
				continue;

			case NAME_nofakecontrast:
				Flag(sd->Flags, WALLF_NOFAKECONTRAST, key);
				continue;

			case NAME_smoothlighting:
				Flag(sd->Flags, WALLF_SMOOTHLIGHTING, key);
				continue;

			case NAME_Wrapmidtex:
				Flag(sd->Flags, WALLF_WRAP_MIDTEX, key);
				continue;

			case NAME_Clipmidtex:
				Flag(sd->Flags, WALLF_CLIP_MIDTEX, key);
				continue;

			case NAME_Nodecals:
				Flag(sd->Flags, WALLF_NOAUTODECALS, key);
				continue;

			default:
				break;

			}
			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Side, index);
			}
		}
		// initialization of these is delayed to allow separate offsets and add them with the global ones.
		sd->AddTextureXOffset(side_t::top, texOfs[0]);
		sd->AddTextureXOffset(side_t::mid, texOfs[0]);
		sd->AddTextureXOffset(side_t::bottom, texOfs[0]);
		sd->AddTextureYOffset(side_t::top, texOfs[1]);
		sd->AddTextureYOffset(side_t::mid, texOfs[1]);
		sd->AddTextureYOffset(side_t::bottom, texOfs[1]);
	}